

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

int Psr_ManReadDeclaration(Psr_Man_t *p,int Type)

{
  Psr_Ntk_t *pPVar1;
  int iVar2;
  Vec_Int_t *vNamesR [4];
  Vec_Int_t *vNames [4];
  int RangeId;
  int NameId;
  int i;
  int Type_local;
  Psr_Man_t *p_local;
  
  vNames[3]._0_4_ = 0;
  vNamesR[3] = &p->pNtk->vInputs;
  vNamesR[0] = &p->pNtk->vOutputsR;
  vNamesR[1] = &p->pNtk->vInoutsR;
  vNamesR[2] = &p->pNtk->vWiresR;
  if ((0 < Type) && (Type < 5)) {
    iVar2 = Psr_ManUtilSkipSpaces(p);
    if (iVar2 == 0) {
      iVar2 = Psr_ManIsChar(p,'[');
      if ((iVar2 == 0) || (vNames[3]._0_4_ = Psr_ManReadRange(p), (int)vNames[3] != 0)) {
        iVar2 = Psr_ManReadNameList(p,&p->vTemp,';');
        if (iVar2 == 0) {
          p_local._4_4_ = Psr_ManErrorSet(p,"Error number 22.",0);
        }
        else {
          for (RangeId = 0; iVar2 = Vec_IntSize(&p->vTemp), RangeId < iVar2; RangeId = RangeId + 1)
          {
            iVar2 = Vec_IntEntry(&p->vTemp,RangeId);
            Vec_IntPush(vNamesR[(long)(Type + -1) + 3],iVar2);
            Vec_IntPush(vNamesR[(long)(Type + -1) + -1],(int)vNames[3]);
            if (Type < 4) {
              pPVar1 = p->pNtk;
              iVar2 = Abc_Var2Lit2(iVar2,Type);
              Vec_IntPush(&pPVar1->vOrder,iVar2);
            }
          }
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = Psr_ManErrorSet(p,"Error number 21.",0);
      }
    }
    else {
      p_local._4_4_ = Psr_ManErrorSet(p,"Error number 20.",0);
    }
    return p_local._4_4_;
  }
  __assert_fail("Type >= PRS_VER_INPUT && Type <= PRS_VER_WIRE",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                ,0x1ff,"int Psr_ManReadDeclaration(Psr_Man_t *, int)");
}

Assistant:

static inline int Psr_ManReadDeclaration( Psr_Man_t * p, int Type )
{
    int i, NameId, RangeId = 0;
    Vec_Int_t * vNames[4]  = { &p->pNtk->vInputs,  &p->pNtk->vOutputs,  &p->pNtk->vInouts,  &p->pNtk->vWires };
    Vec_Int_t * vNamesR[4] = { &p->pNtk->vInputsR, &p->pNtk->vOutputsR, &p->pNtk->vInoutsR, &p->pNtk->vWiresR };
    assert( Type >= PRS_VER_INPUT && Type <= PRS_VER_WIRE );
    if ( Psr_ManUtilSkipSpaces(p) )                                   return Psr_ManErrorSet(p, "Error number 20.", 0);
    if ( Psr_ManIsChar(p, '[') && !(RangeId = Psr_ManReadRange(p)) )  return Psr_ManErrorSet(p, "Error number 21.", 0);
    if ( !Psr_ManReadNameList( p, &p->vTemp, ';' ) )                  return Psr_ManErrorSet(p, "Error number 22.", 0);
    Vec_IntForEachEntry( &p->vTemp, NameId, i )
    {
        Vec_IntPush( vNames[Type - PRS_VER_INPUT], NameId );
        Vec_IntPush( vNamesR[Type - PRS_VER_INPUT], RangeId );
        if ( Type < PRS_VER_WIRE )
            Vec_IntPush( &p->pNtk->vOrder, Abc_Var2Lit2(NameId, Type) );
    }
    return 1;
}